

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
create_attr_block(exr_context_t ctxt,exr_attribute_t **attr,size_t dblocksize,int32_t data_len,
                 uint8_t **data_ptr,char *name,int32_t nlen,char *type,int32_t tlen)

{
  undefined8 *puVar1;
  int in_ECX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  long *in_R8;
  void *in_R9;
  size_t ptralign;
  exr_attribute_t nil;
  exr_attribute_t *nattr;
  uint8_t *ptr;
  size_t attrblocksz;
  size_t alignpad2;
  size_t alignpad1;
  undefined8 *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  exr_result_t local_4;
  
  local_50 = 0x20;
  if (0 < (int)nil.name) {
    local_50 = (long)((int)nil.name + 1) + 0x20;
  }
  if (0 < (int)nil._16_4_) {
    local_50 = (long)(nil._16_4_ + 1) + local_50;
  }
  if (in_RDX == 0) {
    local_40 = 0;
  }
  else {
    local_40 = 8 - (local_50 & 7);
    if (local_40 == 8) {
      local_40 = 0;
    }
    local_50 = in_RDX + local_40 + local_50;
  }
  if (in_ECX < 1) {
    local_48 = 0;
  }
  else {
    local_48 = 8 - (local_50 & 7);
    if (local_48 == 8) {
      local_48 = 0;
    }
    local_50 = (long)in_ECX + local_48 + local_50;
  }
  puVar1 = (undefined8 *)(**(code **)(in_RDI + 0x58))(local_50);
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
  }
  else {
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    *in_RSI = puVar1;
    local_58 = puVar1 + 4;
    if (0 < (int)nil.name) {
      memcpy(local_58,in_R9,(long)((int)nil.name + 1));
      *puVar1 = local_58;
      *(char *)(puVar1 + 2) = (char)(int)nil.name;
      local_58 = (undefined8 *)((long)local_58 + (long)((int)nil.name + 1));
    }
    if (0 < (int)nil._16_4_) {
      memcpy(local_58,nil.type_name,(long)(nil._16_4_ + 1));
      puVar1[1] = local_58;
      *(uint8_t *)((long)puVar1 + 0x11) = nil.name_length;
      local_58 = (undefined8 *)((long)local_58 + (long)(nil._16_4_ + 1));
    }
    local_58 = (undefined8 *)(local_40 + (long)local_58);
    if (in_RDX != 0) {
      puVar1[3] = local_58;
      local_58 = (undefined8 *)(in_RDX + (long)local_58);
    }
    if (in_R8 != (long *)0x0) {
      if (in_ECX < 1) {
        *in_R8 = 0;
      }
      else {
        *in_R8 = local_48 + (long)local_58;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
create_attr_block (
    exr_context_t     ctxt,
    exr_attribute_t** attr,
    size_t            dblocksize,
    int32_t           data_len,
    uint8_t**         data_ptr,
    const char*       name,
    int32_t           nlen,
    const char*       type,
    int32_t           tlen)
{
    size_t           alignpad1, alignpad2;
    size_t           attrblocksz = sizeof (exr_attribute_t);
    uint8_t*         ptr;
    exr_attribute_t* nattr;
    exr_attribute_t  nil = {0};
    // not all compilers have this :(
    //const size_t ptralign = _Alignof(void*);
    const size_t ptralign = 8;

    if (nlen > 0) attrblocksz += (size_t) (nlen + 1);
    if (tlen > 0) attrblocksz += (size_t) (tlen + 1);

    if (dblocksize > 0)
    {
        alignpad1 = ptralign - (attrblocksz % ptralign);
        if (alignpad1 == ptralign) alignpad1 = 0;
        attrblocksz += alignpad1;
        attrblocksz += dblocksize;
    }
    else
        alignpad1 = 0;

    if (data_len > 0)
    {
        /* align the extra data to a pointer */
        alignpad2 = ptralign - (attrblocksz % ptralign);
        if (alignpad2 == ptralign) alignpad2 = 0;
        attrblocksz += alignpad2;
        attrblocksz += (size_t) data_len;
    }
    else
        alignpad2 = 0;

    ptr = (uint8_t*) ctxt->alloc_fn (attrblocksz);
    if (!ptr) return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

    nattr  = (exr_attribute_t*) ptr;
    *nattr = nil;
    *attr  = nattr;
    ptr += sizeof (exr_attribute_t);
    if (nlen > 0)
    {
        memcpy (ptr, name, (size_t) (nlen + 1));
        nattr->name        = (char*) ptr;
        nattr->name_length = (uint8_t) nlen;

        ptr += nlen + 1;
    }
    if (tlen > 0)
    {
        memcpy (ptr, type, (size_t) (tlen + 1));
        nattr->type_name        = (char*) ptr;
        nattr->type_name_length = (uint8_t) tlen;

        ptr += tlen + 1;
    }
    ptr += alignpad1;
    if (dblocksize > 0)
    {
        nattr->rawptr = ptr;
        ptr += dblocksize;
    }
    if (data_ptr)
    {
        if (data_len > 0)
        {
            ptr += alignpad2;
            *data_ptr = ptr;
        }
        else
            *data_ptr = NULL;
    }
    return EXR_ERR_SUCCESS;
}